

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

void helper_mtc0_entryhi_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  ulong uVar1;
  uint uVar2;
  undefined4 in_ECX;
  uint uVar3;
  CPUMIPSState *__mptr;
  uint uVar4;
  undefined1 auVar5 [16];
  
  uVar2 = env->CP0_EntryHi_ASID_mask;
  uVar1._0_4_ = env->CP0_Config3;
  uVar1._4_4_ = env->CP0_Config4;
  auVar5._0_4_ = -(uint)((uVar1 & 4) == 0);
  auVar5._4_4_ = -(uint)((uVar1 & 4) == 0);
  auVar5._8_4_ = -(uint)((uVar1 & 0x4000000000000000) == 0);
  auVar5._12_4_ = -(uint)((uVar1 & 0x4000000000000000) == 0);
  uVar3 = movmskpd(in_ECX,auVar5);
  uVar4 = (arg1 ^ env->CP0_EntryHi) & ((uint)((uVar3 & 2) == 0) << 10 | uVar2 | 0xffffe000);
  env->CP0_EntryHi = uVar4 ^ env->CP0_EntryHi;
  if ((uVar3 & 1) == 0) {
    sync_c0_entryhi(env,env->current_tc);
    uVar2 = env->CP0_EntryHi_ASID_mask;
  }
  if ((uVar2 & uVar4) != 0) {
    tlb_flush_mips((CPUState *)(env[-4].tcs[0xd].mmr + 5));
    return;
  }
  return;
}

Assistant:

void helper_mtc0_entryhi(CPUMIPSState *env, target_ulong arg1)
{
    target_ulong old, val, mask;
    mask = (TARGET_PAGE_MASK << 1) | env->CP0_EntryHi_ASID_mask;
    if (((env->CP0_Config4 >> CP0C4_IE) & 0x3) >= 2) {
        mask |= 1 << CP0EnHi_EHINV;
    }

    /* 1k pages not implemented */
#if defined(TARGET_MIPS64)
    if (env->insn_flags & ISA_MIPS32R6) {
        int entryhi_r = extract64(arg1, 62, 2);
        int config0_at = extract32(env->CP0_Config0, 13, 2);
        bool no_supervisor = (env->CP0_Status_rw_bitmask & 0x8) == 0;
        if ((entryhi_r == 2) ||
            (entryhi_r == 1 && (no_supervisor || config0_at == 1))) {
            /* skip EntryHi.R field if new value is reserved */
            mask &= ~(0x3ull << 62);
        }
    }
    mask &= env->SEGMask;
#endif
    old = env->CP0_EntryHi;
    val = (arg1 & mask) | (old & ~mask);
    env->CP0_EntryHi = val;
    if (env->CP0_Config3 & (1 << CP0C3_MT)) {
        sync_c0_entryhi(env, env->current_tc);
    }
    /* If the ASID changes, flush qemu's TLB.  */
    if ((old & env->CP0_EntryHi_ASID_mask) !=
        (val & env->CP0_EntryHi_ASID_mask)) {
        tlb_flush(env_cpu(env));
    }
}